

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writekey.cpp
# Opt level: O3

int writekey_main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  long *plVar4;
  mcberepair *this;
  long *plVar5;
  string *out;
  basic_istream<char,_std::char_traits<char>_> *in;
  string_view key_00;
  Status status;
  string path;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  Status local_998;
  long *local_990;
  long local_988;
  long local_980;
  long lStack_978;
  char *local_970;
  size_type sStack_968;
  char local_960;
  undefined7 uStack_95f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  string local_930;
  undefined4 local_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  DB local_900;
  
  if ((argc < 4) || (iVar3 = strcmp("help",argv[1]), iVar3 == 0)) {
    printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",*argv);
    return 1;
  }
  mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_950,(mcberepair *)&std::cin,in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,argv[2],(allocator<char> *)&local_970);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_900);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_980 = *plVar5;
    lStack_978 = plVar4[3];
    local_990 = &local_980;
  }
  else {
    local_980 = *plVar5;
    local_990 = (long *)*plVar4;
  }
  local_988 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_900.options_.comparator != (Comparator *)&local_900.options_.env) {
    operator_delete(local_900.options_.comparator,
                    (ulong)((long)&(local_900.options_.env)->_vptr_Env + 1));
  }
  out = (string *)0x0;
  mcberepair::DB::DB(&local_900,(char *)local_990,false,false);
  if ((_Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>)
      local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl == (DB *)0x0) {
    writekey_main();
    iVar3 = 1;
  }
  else {
    sStack_968 = 0;
    local_960 = '\0';
    pcVar1 = argv[3];
    local_970 = &local_960;
    this = (mcberepair *)strlen(pcVar1);
    key_00._M_str = (char *)&local_970;
    key_00._M_len = (size_t)pcVar1;
    bVar2 = mcberepair::decode_key(this,key_00,out);
    if (bVar2) {
      local_930._M_dataplus._M_p = local_970;
      local_930._M_string_length = sStack_968;
      local_910 = local_950._M_dataplus._M_p._0_4_;
      uStack_90c = local_950._M_dataplus._M_p._4_4_;
      uStack_908 = (undefined4)local_950._M_string_length;
      uStack_904 = local_950._M_string_length._4_4_;
      (*(*(_func_int ***)
          local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
          _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
          super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[2])(&local_998);
      __stream = _stderr;
      iVar3 = 0;
      if (local_998.state_ != (char *)0x0) {
        pcVar1 = argv[3];
        leveldb::Status::ToString_abi_cxx11_(&local_930,&local_998);
        fprintf(__stream,"ERROR: Reading key \'%s\' failed: %s\n",pcVar1,local_930._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_dataplus._M_p != &local_930.field_2) {
          operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
        }
        iVar3 = 1;
        if (local_998.state_ != (char *)0x0) {
          operator_delete__(local_998.state_);
        }
      }
    }
    else {
      writekey_main();
      iVar3 = 1;
    }
    if (local_970 != &local_960) {
      operator_delete(local_970,CONCAT71(uStack_95f,local_960) + 1);
    }
  }
  if ((_Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>)
      local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl != (DB *)0x0) {
    (*(*(_func_int ***)
        local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
        _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[1])();
  }
  local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
  super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::DB,_std::default_delete<leveldb::DB>,_true,_true>)
       (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0;
  leveldb::Logger::~Logger(&local_900.info_log.super_Logger);
  if (local_900.block_cache_._M_t.
      super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
      super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0) {
    (**(code **)(*(long *)local_900.block_cache_._M_t.
                          super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>
                          .super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl + 8))();
  }
  local_900.block_cache_._M_t.
  super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
  super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::Cache,_std::default_delete<leveldb::Cache>,_true,_true>)
       (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0;
  if (local_900.filter_policy_._M_t.
      super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
      .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
       )0x0) {
    (*(*(_func_int ***)
        local_900.filter_policy_._M_t.
        super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
        .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl)[1])();
  }
  if (local_990 != &local_980) {
    operator_delete(local_990,local_980 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_950._M_dataplus._M_p._4_4_,local_950._M_dataplus._M_p._0_4_) ==
      &local_950.field_2) {
    return iVar3;
  }
  operator_delete((undefined1 *)
                  CONCAT44(local_950._M_dataplus._M_p._4_4_,local_950._M_dataplus._M_p._0_4_),
                  local_950.field_2._M_allocated_capacity + 1);
  return iVar3;
}

Assistant:

int writekey_main(int argc, char* argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",
               argv[0]);
        return EXIT_FAILURE;
    }

#ifdef _WIN32
    _setmode(_fileno(stdin), O_BINARY);
#endif

    // slurp from stdin into value before we open db
    auto value = mcberepair::slurp_string(std::cin);

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    // open the database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    std::string key;
    if(!mcberepair::decode_key(argv[3], &key)) {
        fprintf(stderr, "ERROR: key '%s' is malformed\n", argv[3]);
        return EXIT_FAILURE;
    }

    leveldb::Status status = db().Put({}, key, value);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: Reading key '%s' failed: %s\n", argv[3],
                status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }

    return EXIT_SUCCESS;
}